

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O2

void __thiscall libtorrent::aux::socks5::socks_forward_udp(socks5 *this)

{
  endpoint local_ep;
  char *local_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_50;
  mutable_buffer local_30;
  
  (this->m_tmp_buf)._M_elems[0] = '\x05';
  (this->m_tmp_buf)._M_elems[1] = '\x03';
  (this->m_tmp_buf)._M_elems[2] = '\0';
  local_70 = (this->m_tmp_buf)._M_elems + 3;
  if (this->m_send_local_ep == true) {
    listen_socket_handle::get_local_endpoint((endpoint *)&local_50,&this->m_listen_socket);
    *local_70 = ((short)local_50._M_f != 2) * '\x03' + '\x01';
    local_70 = local_70 + 1;
    write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char*&>
              ((basic_endpoint<boost::asio::ip::tcp> *)&local_50,&local_70);
  }
  else {
    (this->m_tmp_buf)._M_elems[3] = '\x01';
    local_70 = (this->m_tmp_buf)._M_elems + 4;
    write_impl<unsigned_int,int,char*>(0,&local_70);
    write_impl<unsigned_short,int,char*>(0,&local_70);
  }
  local_30.size_ = (long)local_70 - (long)&this->m_tmp_buf;
  local_30.data_ = &this->m_tmp_buf;
  ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::socks5,void>
            ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_50._M_f = (offset_in_socks5_to_subr)connect1;
  local_50._8_8_ = 0;
  local_50._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
  local_50._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
  super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_60[0]._M_pi;
  local_68 = (element_type *)0x0;
  a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::asio::
  async_write<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::mutable_buffer,std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
            (&this->m_socks5_sock,&local_30,&local_50,(type *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_50._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>
                     .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>.
                     _M_head_impl.
                     super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> + 8));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
  return;
}

Assistant:

void socks5::socks_forward_udp()
{
	using namespace libtorrent::aux;

	// send SOCKS5 UDP command
	char* p = m_tmp_buf.data();
	write_uint8(5, p); // SOCKS VERSION 5
	write_uint8(3, p); // UDP ASSOCIATE command
	write_uint8(0, p); // reserved

	if (m_send_local_ep)
	{
		auto const local_ep = m_listen_socket.get_local_endpoint();
		write_uint8(aux::is_v4(local_ep) ? 1 : 4, p); // atyp
		write_endpoint(local_ep, p);
	}
	else
	{
		write_uint8(1, p); // ATYP = IPv4
		write_uint32(0, p); // 0.0.0.0
		write_uint16(0, p); // :0
	}

	TORRENT_ASSERT_VAL(p - m_tmp_buf.data() < int(m_tmp_buf.size()), (p - m_tmp_buf.data()));
	ADD_OUTSTANDING_ASYNC("socks5::connect1");
	boost::asio::async_write(m_socks5_sock
		, boost::asio::buffer(m_tmp_buf.data(), aux::numeric_cast<std::size_t>(p - m_tmp_buf.data()))
		, std::bind(&socks5::connect1, self(), _1));
}